

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  byte bVar1;
  int iVar2;
  undefined1 *puVar3;
  char *pcVar4;
  byte *pbVar5;
  size_t __n;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  void **ppvVar11;
  char *pcVar12;
  char *end;
  char *pcVar13;
  long lVar14;
  char syntax [200];
  char local_113 [3];
  void **local_110;
  char *local_108;
  long local_100;
  char local_f8 [200];
  
  pbVar5 = (byte *)*argtable;
  local_110 = argtable;
  local_108 = suffix;
  if (pbVar5 == (byte *)0x0) {
    pcVar13 = " [-%c";
  }
  else {
    ppvVar11 = argtable + 1;
    pcVar4 = " -%c";
    pcVar13 = " [-%c";
    do {
      if ((*pbVar5 & 1) != 0) break;
      if ((0 < *(int *)(pbVar5 + 0x28)) &&
         ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar4,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
        pcVar4 = "%c";
        pcVar13 = "[%c";
      }
      pbVar5 = (byte *)*ppvVar11;
      ppvVar11 = ppvVar11 + 1;
    } while (pbVar5 != (byte *)0x0);
  }
  pbVar5 = (byte *)*local_110;
  if (pbVar5 == (byte *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = "";
    ppvVar11 = local_110;
    do {
      ppvVar11 = ppvVar11 + 1;
      if ((*pbVar5 & 1) != 0) break;
      if ((*(int *)(pbVar5 + 0x28) < 1) &&
         ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar13,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
        pcVar13 = "%c";
        pcVar4 = "]";
      }
      pbVar5 = (byte *)*ppvVar11;
    } while (pbVar5 != (byte *)0x0);
  }
  arg_dstr_catf(ds,"%s",pcVar4);
  pbVar5 = (byte *)*local_110;
  if (pbVar5 != (byte *)0x0) {
    lVar14 = 0;
    ppvVar11 = local_110;
    do {
      pcVar13 = local_f8 + 199;
      if ((*pbVar5 & 1) != 0) break;
      memset(local_f8,0,200);
      puVar3 = *(undefined1 **)(pbVar5 + 8);
      if ((puVar3 == (undefined1 *)0x0) || ((*pbVar5 & 2) != 0)) {
        lVar6 = *(long *)(pbVar5 + 0x18);
        bVar1 = *pbVar5;
        if (puVar3 == (undefined1 *)0x0) {
          pcVar4 = *(char **)(pbVar5 + 0x10);
          if (pcVar4 == (char *)0x0) {
            ppvVar11 = local_110;
            if (lVar6 != 0) {
              uVar8 = 0;
              if ((bVar1 & 4) == 0) {
                do {
                  if (local_f8[uVar8] == '\0') goto LAB_001095aa;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != 199);
                uVar8 = 199;
LAB_001095aa:
                pcVar4 = local_f8 + uVar8;
                pcVar12 = pcVar4;
                if (uVar8 < 199) {
                  lVar9 = 0;
                  do {
                    if (*(char *)(lVar6 + lVar9) == '\0') goto LAB_0010956d;
                    pcVar4[lVar9] = *(char *)(lVar6 + lVar9);
                    lVar9 = lVar9 + 1;
                    pcVar12 = pcVar13;
                  } while (199 - uVar8 != lVar9);
                }
              }
              else {
                do {
                  if (local_f8[uVar8] == '\0') goto LAB_00109793;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != 199);
                uVar8 = 199;
LAB_00109793:
                pcVar4 = local_f8 + uVar8;
                if (uVar8 < 199) {
                  lVar9 = 0;
                  do {
                    if (lVar9 == 1) break;
                    pcVar4[lVar9] = " ["[lVar9 + 1];
                    lVar9 = lVar9 + 1;
                  } while (199 - uVar8 != lVar9);
                  pcVar4 = pcVar4 + lVar9;
                }
                *pcVar4 = '\0';
                if (pcVar13 != pcVar4 && -1 < (long)pcVar13 - (long)pcVar4) {
                  do {
                    if (*pcVar4 == '\0') break;
                    pcVar4 = pcVar4 + 1;
                  } while (pcVar4 < pcVar13);
                }
                if (pcVar4 < pcVar13) {
                  lVar9 = 0;
                  do {
                    if (*(char *)(lVar6 + lVar9) == '\0') break;
                    pcVar4[lVar9] = *(char *)(lVar6 + lVar9);
                    lVar9 = lVar9 + 1;
                  } while ((long)pcVar13 - (long)pcVar4 != lVar9);
                  pcVar4 = pcVar4 + lVar9;
                }
                *pcVar4 = '\0';
                if (0 < (long)pcVar13 - (long)pcVar4) {
                  do {
                    if (*pcVar4 == '\0') break;
                    pcVar4 = pcVar4 + 1;
                  } while (pcVar4 < pcVar13);
                }
                pcVar12 = pcVar4;
                if (pcVar4 < pcVar13) {
                  lVar9 = 0;
                  do {
                    if (lVar9 == 1) break;
                    pcVar4[lVar9] = "[[TRACE]]"[lVar9 + 8];
                    lVar9 = lVar9 + 1;
                  } while ((long)pcVar13 - (long)pcVar4 != lVar9);
                  goto LAB_0010956d;
                }
              }
              goto LAB_00109570;
            }
          }
          else {
            uVar8 = 0;
            do {
              if (local_f8[uVar8] == '\0') goto LAB_001092f1;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 199);
            uVar8 = 199;
LAB_001092f1:
            pcVar12 = local_f8 + uVar8;
            if (uVar8 < 199) {
              lVar9 = 0;
              do {
                if (lVar9 == 2) break;
                pcVar12[lVar9] = "--"[lVar9];
                lVar9 = lVar9 + 1;
              } while (199 - uVar8 != lVar9);
              pcVar12 = pcVar12 + lVar9;
            }
            *pcVar12 = '\0';
            uVar8 = (long)pcVar13 - (long)pcVar12;
            local_100 = lVar6;
            __n = strcspn(pcVar4,",");
            if (uVar8 <= __n) {
              __n = uVar8;
            }
            strncat(pcVar12,pcVar4,__n);
            ppvVar11 = local_110;
            if (local_100 != 0) {
              pcVar4 = pcVar12 + uVar8;
              if (0 < (long)uVar8) {
                do {
                  if (*pcVar12 == '\0') break;
                  pcVar12 = pcVar12 + 1;
                } while (pcVar12 < pcVar4);
              }
              if (pcVar12 < pcVar4) {
                lVar6 = 0;
                do {
                  if (lVar6 == 1) break;
                  pcVar12[lVar6] = "="[lVar6];
                  lVar6 = lVar6 + 1;
                } while ((long)pcVar13 - (long)pcVar12 != lVar6);
                pcVar12 = pcVar12 + lVar6;
              }
              *pcVar12 = '\0';
              if ((bVar1 & 4) == 0) {
                if (0 < (long)pcVar13 - (long)pcVar12) {
                  do {
                    if (*pcVar12 == '\0') break;
                    pcVar12 = pcVar12 + 1;
                  } while (pcVar12 < pcVar13);
                }
                if (pcVar12 < pcVar13) {
                  lVar6 = 0;
                  do {
                    if (*(char *)(local_100 + lVar6) == '\0') break;
                    pcVar12[lVar6] = *(char *)(local_100 + lVar6);
                    lVar6 = lVar6 + 1;
                  } while ((long)pcVar13 - (long)pcVar12 != lVar6);
LAB_0010968f:
                  pcVar12 = pcVar12 + lVar6;
                }
              }
              else {
                if (pcVar13 != pcVar12 && -1 < (long)pcVar13 - (long)pcVar12) {
                  do {
                    if (*pcVar12 == '\0') break;
                    pcVar12 = pcVar12 + 1;
                  } while (pcVar12 < pcVar13);
                }
                if (pcVar12 < pcVar13) {
                  lVar6 = 0;
                  do {
                    if (lVar6 == 1) break;
                    pcVar12[lVar6] = " ["[lVar6 + 1];
                    lVar6 = lVar6 + 1;
                  } while ((long)pcVar13 - (long)pcVar12 != lVar6);
                  pcVar12 = pcVar12 + lVar6;
                }
                *pcVar12 = '\0';
                if (pcVar13 != pcVar12 && -1 < (long)pcVar13 - (long)pcVar12) {
                  do {
                    if (*pcVar12 == '\0') break;
                    pcVar12 = pcVar12 + 1;
                  } while (pcVar12 < pcVar13);
                }
                if (pcVar12 < pcVar13) {
                  lVar6 = 0;
                  do {
                    if (*(char *)(local_100 + lVar6) == '\0') break;
                    pcVar12[lVar6] = *(char *)(local_100 + lVar6);
                    lVar6 = lVar6 + 1;
                  } while ((long)pcVar13 - (long)pcVar12 != lVar6);
                  pcVar12 = pcVar12 + lVar6;
                }
                *pcVar12 = '\0';
                if (pcVar13 != pcVar12 && -1 < (long)pcVar13 - (long)pcVar12) {
                  do {
                    if (*pcVar12 == '\0') break;
                    pcVar12 = pcVar12 + 1;
                  } while (pcVar12 < pcVar13);
                }
                if (pcVar12 < pcVar13) {
                  lVar6 = 0;
                  do {
                    if (lVar6 == 1) break;
                    pcVar12[lVar6] = "[[TRACE]]"[lVar6 + 8];
                    lVar6 = lVar6 + 1;
                  } while ((long)pcVar13 - (long)pcVar12 != lVar6);
                  goto LAB_0010968f;
                }
              }
              *pcVar12 = '\0';
            }
          }
        }
        else {
          local_113[0] = '-';
          local_113[1] = *puVar3;
          local_113[2] = 0;
          uVar8 = 0;
          do {
            if (local_f8[uVar8] == '\0') goto LAB_00109283;
            uVar8 = uVar8 + 1;
          } while (uVar8 != 199);
          uVar8 = 199;
LAB_00109283:
          pcVar12 = local_f8 + uVar8;
          pcVar4 = pcVar12;
          if (uVar8 < 199) {
            lVar9 = 0;
            do {
              if (local_113[lVar9] == '\0') {
                pcVar4 = pcVar12 + lVar9;
                break;
              }
              pcVar12[lVar9] = local_113[lVar9];
              lVar9 = lVar9 + 1;
              pcVar4 = pcVar13;
            } while (199 - uVar8 != lVar9);
          }
          *pcVar4 = '\0';
          if (lVar6 != 0) {
            if (pcVar13 != pcVar4 && -1 < (long)pcVar13 - (long)pcVar4) {
              do {
                if (*pcVar4 == '\0') break;
                pcVar4 = pcVar4 + 1;
              } while (pcVar4 < pcVar13);
            }
            if (pcVar4 < pcVar13) {
              lVar9 = 0;
              do {
                if (lVar9 == 1) break;
                pcVar4[lVar9] = "%d msec(s), "[lVar9 + 0xb];
                lVar9 = lVar9 + 1;
              } while ((long)pcVar13 - (long)pcVar4 != lVar9);
              pcVar4 = pcVar4 + lVar9;
            }
            *pcVar4 = '\0';
            if ((bVar1 & 4) == 0) {
              if (0 < (long)pcVar13 - (long)pcVar4) {
                do {
                  if (*pcVar4 == '\0') break;
                  pcVar4 = pcVar4 + 1;
                } while (pcVar4 < pcVar13);
              }
              pcVar12 = pcVar4;
              if (pcVar4 < pcVar13) {
                lVar9 = 0;
                do {
                  if (*(char *)(lVar6 + lVar9) == '\0') break;
                  pcVar4[lVar9] = *(char *)(lVar6 + lVar9);
                  lVar9 = lVar9 + 1;
                } while ((long)pcVar13 - (long)pcVar4 != lVar9);
LAB_0010956d:
                pcVar12 = pcVar4 + lVar9;
              }
            }
            else {
              if (0 < (long)pcVar13 - (long)pcVar4) {
                do {
                  if (*pcVar4 == '\0') break;
                  pcVar4 = pcVar4 + 1;
                } while (pcVar4 < pcVar13);
              }
              if (pcVar4 < pcVar13) {
                lVar9 = 0;
                do {
                  if (lVar9 == 1) break;
                  pcVar4[lVar9] = " ["[lVar9 + 1];
                  lVar9 = lVar9 + 1;
                } while ((long)pcVar13 - (long)pcVar4 != lVar9);
                pcVar4 = pcVar4 + lVar9;
              }
              *pcVar4 = '\0';
              if (pcVar13 != pcVar4 && -1 < (long)pcVar13 - (long)pcVar4) {
                do {
                  if (*pcVar4 == '\0') break;
                  pcVar4 = pcVar4 + 1;
                } while (pcVar4 < pcVar13);
              }
              if (pcVar4 < pcVar13) {
                lVar9 = 0;
                do {
                  if (*(char *)(lVar6 + lVar9) == '\0') break;
                  pcVar4[lVar9] = *(char *)(lVar6 + lVar9);
                  lVar9 = lVar9 + 1;
                } while ((long)pcVar13 - (long)pcVar4 != lVar9);
                pcVar4 = pcVar4 + lVar9;
              }
              *pcVar4 = '\0';
              if (0 < (long)pcVar13 - (long)pcVar4) {
                do {
                  if (*pcVar4 == '\0') break;
                  pcVar4 = pcVar4 + 1;
                } while (pcVar4 < pcVar13);
              }
              pcVar12 = pcVar4;
              if (pcVar4 < pcVar13) {
                lVar9 = 0;
                do {
                  if (lVar9 == 1) break;
                  pcVar4[lVar9] = "[[TRACE]]"[lVar9 + 8];
                  lVar9 = lVar9 + 1;
                } while ((long)pcVar13 - (long)pcVar4 != lVar9);
                goto LAB_0010956d;
              }
            }
LAB_00109570:
            *pcVar12 = '\0';
          }
        }
        if (local_f8[0] != '\0') {
          pvVar7 = ppvVar11[lVar14];
          iVar2 = *(int *)((long)pvVar7 + 0x28);
          if (0 < iVar2) {
            iVar10 = 0;
            do {
              arg_dstr_cat(ds," ");
              arg_dstr_cat(ds,local_f8);
              iVar10 = iVar10 + 1;
              pvVar7 = ppvVar11[lVar14];
              iVar2 = *(int *)((long)pvVar7 + 0x28);
            } while (iVar10 < iVar2);
          }
          iVar10 = *(int *)((long)pvVar7 + 0x2c) - iVar2;
          if (*(int *)((long)pvVar7 + 0x2c) != iVar2) {
            pcVar13 = "]";
            if (iVar10 != 1) {
              if (iVar10 == 2) {
                arg_dstr_cat(ds," [");
                arg_dstr_cat(ds,local_f8);
                pcVar13 = "]";
                arg_dstr_cat(ds,"]");
              }
              else {
                pcVar13 = "]...";
              }
            }
            arg_dstr_cat(ds," [");
            arg_dstr_cat(ds,local_f8);
            arg_dstr_cat(ds,pcVar13);
          }
        }
      }
      pbVar5 = (byte *)ppvVar11[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while (pbVar5 != (byte *)0x0);
  }
  if (local_108 != (char *)0x0) {
    arg_dstr_cat(ds,local_108);
  }
  return;
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}